

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O1

Int128 * helper_atomic_cmpxchgo_be_mmu_sparc64
                   (Int128 *__return_storage_ptr__,CPUArchState_conflict19 *env,target_ulong addr,
                   Int128 cmpv,Int128 newv,TCGMemOpIdx oi,uintptr_t retaddr)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  uint in_register_0000000c;
  ulong in_R9;
  ulong uVar3;
  
  pauVar2 = (undefined1 (*) [16])
            atomic_mmu_lookup((CPUArchState_conflict19 *)__return_storage_ptr__,(target_ulong)env,
                              (TCGMemOpIdx)cmpv,cmpv._8_8_);
  uVar3 = addr >> 0x38 | (addr & 0xff000000000000) >> 0x28 | (addr & 0xff0000000000) >> 0x18 |
          (addr & 0xff00000000) >> 8 | (addr & 0xff000000) << 8 | (addr & 0xff0000) << 0x18 |
          (addr & 0xff00) << 0x28 | addr << 0x38;
  LOCK();
  auVar1._8_8_ = uVar3;
  auVar1._0_8_ = (ulong)(in_register_0000000c >> 0x18) |
                 (((ulong)in_register_0000000c & 0xff0000) << 0x20) >> 0x28 |
                 (((ulong)in_register_0000000c & 0xff00) << 0x20) >> 0x18 |
                 (((ulong)in_register_0000000c & 0xff) << 0x20) >> 8 | ((ulong)oi & 0xff000000) << 8
                 | ((ulong)oi & 0xff0000) << 0x18 | ((ulong)oi & 0xff00) << 0x28 |
                 CONCAT44(in_register_0000000c,oi) << 0x38;
  if (auVar1 == *pauVar2) {
    *(ulong *)*pauVar2 =
         in_R9 >> 0x38 | (in_R9 & 0xff000000000000) >> 0x28 | (in_R9 & 0xff0000000000) >> 0x18 |
         (in_R9 & 0xff00000000) >> 8 | (in_R9 & 0xff000000) << 8 | (in_R9 & 0xff0000) << 0x18 |
         (in_R9 & 0xff00) << 0x28 | in_R9 << 0x38;
    *(uintptr_t *)(*pauVar2 + 8) =
         retaddr >> 0x38 | (retaddr & 0xff000000000000) >> 0x28 | (retaddr & 0xff0000000000) >> 0x18
         | (retaddr & 0xff00000000) >> 8 | (retaddr & 0xff000000) << 8 |
         (retaddr & 0xff0000) << 0x18 | (retaddr & 0xff00) << 0x28 | retaddr << 0x38;
  }
  else {
    uVar3 = SUB168(*pauVar2,8);
  }
  UNLOCK();
  return (Int128 *)
         (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
          (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
          (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;
#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, BSWAP(cmpv), BSWAP(newv));
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, BSWAP(cmpv), BSWAP(newv));
#else
    ret = atomic_cmpxchg__nocheck(haddr, BSWAP(cmpv), BSWAP(newv));
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}